

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O0

void tandem::detail::add_maximal_periodicities<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
               LZBlock *prev_block,LZBlock *block,uint32_t min_period,uint32_t max_period,
               LMRVector *result)

{
  uint uVar1;
  uint *puVar2;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint lp_1;
  uint ls_1;
  uint32_t j_1;
  uint local_54;
  uint local_50;
  uint lp;
  uint ls;
  uint32_t j;
  uint32_t end;
  uint t;
  uint32_t local_38;
  uint m;
  uint32_t n;
  uint32_t u;
  LMRVector *result_local;
  uint32_t max_period_local;
  uint32_t min_period_local;
  LZBlock *block_local;
  LZBlock *prev_block_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  m = block->pos;
  local_38 = block->length;
  end = prev_block->length * 2 + local_38;
  _n = (deque<tandem::Repeat,std::allocator<tandem::Repeat>> *)result;
  result_local._0_4_ = max_period;
  result_local._4_4_ = min_period;
  _max_period_local = block;
  block_local = prev_block;
  prev_block_local = (LZBlock *)str;
  puVar2 = std::min<unsigned_int>(&m,&end);
  t = *puVar2;
  j = m - t;
  ls = m + local_38;
  lp = result_local._4_4_;
  while( true ) {
    uVar1 = lp;
    puVar2 = std::min<unsigned_int>(&local_38,(uint *)&result_local);
    if (*puVar2 < uVar1) break;
    local_50 = backward_lce<std::__cxx11::string,unsigned_int>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          prev_block_local,m - 1,(m + lp) - 1,j);
    local_54 = forward_lce<std::__cxx11::string,unsigned_int>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          prev_block_local,m + lp,m,ls);
    if ((lp <= local_50 + local_54) && (lp + local_54 < local_38)) {
      j_1 = m - local_50;
      ls_1 = lp + local_54 + local_50;
      std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
      emplace_back<unsigned_int,unsigned_int,unsigned_int&>(_n,&j_1,&ls_1,&lp);
    }
    lp = lp + 1;
  }
  lp_1 = result_local._4_4_;
  while( true ) {
    uVar1 = lp_1;
    puVar2 = std::min<unsigned_int>(&t,(uint *)&result_local);
    if (*puVar2 <= uVar1) break;
    local_64 = backward_lce<std::__cxx11::string,unsigned_int>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          prev_block_local,(m - lp_1) - 1,m - 1,j);
    local_68 = forward_lce<std::__cxx11::string,unsigned_int>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          prev_block_local,m,m - lp_1,ls);
    if (lp_1 <= local_64 + local_68) {
      local_6c = m - (local_64 + lp_1);
      local_70 = lp_1 + local_68 + local_64;
      std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
      emplace_back<unsigned_int,unsigned_int,unsigned_int&>(_n,&local_6c,&local_70,&lp_1);
    }
    lp_1 = lp_1 + 1;
  }
  return;
}

Assistant:

void add_maximal_periodicities(const T& str, const LZBlock& prev_block, const LZBlock& block,
                               const std::uint32_t min_period, const std::uint32_t max_period,
                               LMRVector& result)
{
    const auto u   = block.pos;
    const auto n   = block.length;
    const auto m   = std::min(u, 2 * prev_block.length + n);
    const auto t   = u - m;
    const auto end = u + n;
    // rightmax periodicities
    for (auto j = min_period; j <= std::min(n, max_period); ++j) {
        const auto ls = backward_lce(str, u - 1, u + j - 1, t);
        const auto lp = forward_lce(str, u + j, u, end);
        if (ls + lp >= j && j + lp < n) {
            result.emplace_back(u - ls, j + lp + ls, j);
        }
    }
    // leftmax periodicities
    for (auto j = min_period; j < std::min(m, max_period); ++j) {
        const auto ls = backward_lce(str, u - j - 1, u - 1, t);
        const auto lp = forward_lce(str, u, u - j, end);
        if (ls + lp >= j) {
            result.emplace_back(u - (ls + j), j + lp + ls, j);
        }
    }
}